

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall
smf::Binasc::readMidiEvent(Binasc *this,ostream *out,istream *infile,int *trackbytes,int *command)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  long *plVar7;
  undefined8 *puVar8;
  uint uVar9;
  long *plVar10;
  int key;
  int key_00;
  uint uVar11;
  char *pcVar12;
  Binasc *pBVar13;
  uchar ch;
  string comment;
  stringstream output;
  byte local_231;
  Binasc *local_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  int local_204;
  ostream *local_200;
  char *local_1f8;
  long local_1f0;
  char local_1e8 [16];
  string local_1d8;
  stringstream local_1b8 [16];
  Binasc local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_230 = this;
  local_200 = out;
  iVar4 = getVLV(this,infile,trackbytes);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"v",1);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_1a8,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = '\0';
  local_231 = 0;
  std::istream::read((char *)infile,(long)&local_231);
  *trackbytes = *trackbytes + 1;
  if ((char)local_231 < '\0') {
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
    std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
    *command = (uint)local_231;
    pBVar13 = (Binasc *)infile;
    std::istream::read((char *)infile,(long)&local_231);
    *trackbytes = *trackbytes + 1;
  }
  else {
    pBVar13 = &local_1a8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"   ",3);
  }
  bVar1 = local_231;
  uVar5 = *command;
  uVar9 = (uVar5 & 0xf0) - 0x80 >> 4;
  local_204 = 1;
  if (7 < uVar9) goto LAB_001264c5;
  uVar11 = (uint)(char)local_231;
  switch(uVar9) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,uVar11);
    std::istream::read((char *)infile,(long)&local_231);
    *trackbytes = *trackbytes + 1;
    iVar4 = (int)(char)local_231;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,iVar4);
    if (local_230->m_commentsQ != 0) {
      keyToPitchName_abi_cxx11_(&local_1d8,(Binasc *)(ulong)uVar11,key);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x129bb4);
      local_228 = &local_218;
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_218 = *plVar10;
        lStack_210 = plVar7[3];
      }
      else {
        local_218 = *plVar10;
        local_228 = (long *)*plVar7;
      }
      local_220 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_228);
LAB_00126908:
      if (local_228 != &local_218) {
        operator_delete(local_228);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
    }
    break;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,uVar11);
    std::istream::read((char *)infile,(long)&local_231);
    bVar1 = local_231;
    *trackbytes = *trackbytes + 1;
    iVar4 = (int)(char)local_231;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,iVar4);
    if (local_230->m_commentsQ != 0) {
      if (bVar1 == 0) {
        keyToPitchName_abi_cxx11_(&local_1d8,(Binasc *)(ulong)uVar11,key_00);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x129bb4);
        local_228 = &local_218;
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_218 = *plVar7;
          lStack_210 = puVar8[3];
        }
        else {
          local_218 = *plVar7;
          local_228 = (long *)*puVar8;
        }
        local_220 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_228);
      }
      else {
        keyToPitchName_abi_cxx11_(&local_1d8,(Binasc *)(ulong)uVar11,key_00);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x129bbe);
        local_228 = &local_218;
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_218 = *plVar7;
          lStack_210 = puVar8[3];
        }
        else {
          local_218 = *plVar7;
          local_228 = (long *)*puVar8;
        }
        local_220 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_228);
      }
      goto LAB_00126908;
    }
    break;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,uVar11);
    std::istream::read((char *)infile,(long)&local_231);
    *trackbytes = *trackbytes + 1;
    iVar4 = (int)(char)local_231;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,iVar4);
    iVar4 = local_230->m_commentsQ;
    goto joined_r0x001261ab;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,uVar11);
    std::istream::read((char *)infile,(long)&local_231);
    *trackbytes = *trackbytes + 1;
    iVar4 = (int)(char)local_231;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,iVar4);
    iVar4 = local_230->m_commentsQ;
joined_r0x001261ab:
    if (iVar4 != 0) {
LAB_001264bb:
      std::__cxx11::string::append((char *)&local_1f8);
    }
    break;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,uVar11);
    if (local_230->m_commentsQ == 0) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\t",1);
    std::__cxx11::string::append((char *)&local_1f8);
    std::__cxx11::string::append((char *)&local_1f8);
    goto LAB_001264bb;
  case 5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,uVar11);
    iVar4 = local_230->m_commentsQ;
    goto joined_r0x001264b2;
  case 6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,uVar11);
    std::istream::read((char *)infile,(long)&local_231);
    *trackbytes = *trackbytes + 1;
    iVar4 = (int)(char)local_231;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,iVar4);
    iVar4 = local_230->m_commentsQ;
joined_r0x001264b2:
    if (iVar4 == 0) break;
    goto LAB_001264bb;
  case 7:
    if ((int)uVar5 < 0xfe) {
      if (uVar5 == 0xf0) {
        iVar4 = getVLV(pBVar13,infile,trackbytes);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," v",2);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
        std::ostream::operator<<((ostream *)&local_1a8,iVar4);
        if (0 < iVar4) {
          do {
            std::istream::read((char *)infile,(long)&local_231);
            *trackbytes = *trackbytes + 1;
            pcVar12 = " ";
            if (local_231 < 0x10) {
              pcVar12 = " 0";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,pcVar12,(ulong)(local_231 < 0x10) + 1);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
      }
      else if (uVar5 == 0xf7) {
        pBVar13 = (Binasc *)infile;
        std::istream::putback((char)infile);
        *trackbytes = *trackbytes + -1;
        iVar4 = getVLV(pBVar13,infile,trackbytes);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," v",2);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
        std::ostream::operator<<((ostream *)&local_1a8,iVar4);
        if (0 < iVar4) {
          do {
            std::istream::read((char *)infile,(long)&local_231);
            *trackbytes = *trackbytes + 1;
            pcVar12 = " ";
            if (local_231 < 0x10) {
              pcVar12 = " 0";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,pcVar12,(ulong)(local_231 < 0x10) + 1);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
      }
      break;
    }
    if (uVar5 == 0xfe) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error command not yet handled",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      local_204 = 0;
      std::ostream::flush();
      goto LAB_00126533;
    }
    if (uVar5 != 0xff) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
    pBVar13 = &local_1a8;
    std::ostream::operator<<((ostream *)&local_1a8,(uint)bVar1);
    iVar4 = getVLV(pBVar13,infile,trackbytes);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," v",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,iVar4);
    uVar5 = (uint)bVar1;
    if (0x1f < uVar5) {
      switch(uVar5) {
      case 0x51:
        std::istream::read((char *)infile,(long)&local_231);
        bVar1 = local_231;
        *trackbytes = *trackbytes + 1;
        std::istream::read((char *)infile,(long)&local_231);
        bVar2 = local_231;
        *trackbytes = *trackbytes + 1;
        std::istream::read((char *)infile,(long)&local_231);
        bVar3 = local_231;
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," t",2);
        std::ostream::_M_insert<double>
                  ((1000000.0 / (double)((uint)bVar2 << 8 | (uint)bVar1 << 0x10 | (uint)bVar3)) *
                   60.0);
        goto switchD_001269fd_caseD_51;
      case 0x52:
      case 0x53:
      case 0x55:
      case 0x56:
      case 0x57:
        goto switchD_0012694d_caseD_52;
      case 0x54:
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        goto switchD_001269fd_caseD_54;
      case 0x58:
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        goto switchD_001269fd_caseD_58;
      case 0x59:
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        std::istream::read((char *)infile,(long)&local_231);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
        goto switchD_001269fd_caseD_59;
      default:
        if (uVar5 - 0x20 < 2) {
          std::istream::read((char *)infile,(long)&local_231);
          *trackbytes = *trackbytes + 1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
          std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
          goto LAB_001266bc;
        }
        goto switchD_0012694d_caseD_52;
      }
    }
    if (uVar5 - 1 < 9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \"",2);
      if (0 < iVar4) {
        do {
          std::istream::read((char *)infile,(long)&local_231);
          *trackbytes = *trackbytes + 1;
          if (local_231 == 0x22) {
            local_228 = (long *)CONCAT71(local_228._1_7_,0x5c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(char *)&local_228,1);
          }
          local_228 = (long *)CONCAT71(local_228._1_7_,local_231);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)&local_228,1);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\"",1);
      goto LAB_001266bc;
    }
    if (bVar1 != 0) goto switchD_0012694d_caseD_52;
    std::istream::read((char *)infile,(long)&local_231);
    bVar1 = local_231;
    *trackbytes = *trackbytes + 1;
    std::istream::read((char *)infile,(long)&local_231);
    bVar2 = local_231;
    *trackbytes = *trackbytes + 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," 2\'",3);
    std::ostream::operator<<((ostream *)&local_1a8,(uint)CONCAT11(bVar1,bVar2));
switchD_001266e2_caseD_0:
    goto LAB_00126e6e;
  }
  goto LAB_001264c5;
switchD_0012694d_caseD_52:
  if (0 < iVar4) {
    do {
      std::istream::read((char *)infile,(long)&local_231);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
      if (local_231 < 0x10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"0",1);
      }
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)&local_1a8,(uint)local_231);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
LAB_001266bc:
  if (bVar1 < 0x21) {
    switch(bVar1) {
    case 0:
      goto switchD_001266e2_caseD_0;
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      break;
    case 6:
      break;
    case 7:
      break;
    case 8:
      break;
    case 9:
      break;
    default:
      if (bVar1 != 0x20) goto switchD_001269fd_caseD_52;
    }
  }
  else if (bVar1 < 0x51) {
    if (bVar1 != 0x21) {
      if (bVar1 == 0x2f) {
        local_204 = 0;
        std::__cxx11::string::append((char *)&local_1f8);
        goto LAB_001264c5;
      }
      goto switchD_001269fd_caseD_52;
    }
  }
  else {
    switch(bVar1) {
    case 0x51:
switchD_001269fd_caseD_51:
      break;
    case 0x52:
    case 0x53:
    case 0x55:
    case 0x56:
    case 0x57:
switchD_001269fd_caseD_52:
      break;
    case 0x54:
switchD_001269fd_caseD_54:
      break;
    case 0x58:
switchD_001269fd_caseD_58:
      break;
    case 0x59:
switchD_001269fd_caseD_59:
      break;
    default:
      if (bVar1 != 0x7f) goto switchD_001269fd_caseD_52;
    }
  }
LAB_00126e6e:
  std::__cxx11::string::append((char *)&local_1f8);
LAB_001264c5:
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>(local_200,(char *)local_228,local_220);
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_230->m_commentsQ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_200,"\t; ",3);
    std::__ostream_insert<char,std::char_traits<char>>(local_200,local_1f8,local_1f0);
  }
LAB_00126533:
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_204;
}

Assistant:

int Binasc::readMidiEvent(std::ostream& out, std::istream& infile,
		int& trackbytes, int& command) {

	// Read and print Variable Length Value for delta ticks
	int vlv = getVLV(infile, trackbytes);

	std::stringstream output;

	output << "v" << std::dec << vlv << "\t";

	std::string comment;

	int status = 1;
	uchar ch = 0;
	char byte1, byte2;
	infile.read((char*)&ch, 1);
	trackbytes++;
	if (ch < 0x80) {
		// running status: command byte is previous one in data stream
		output << "   ";
	} else {
		// midi command byte
		output << std::hex << (int)ch;
		command = ch;
		infile.read((char*)&ch, 1);
		trackbytes++;
	}
	byte1 = ch;
	switch (command & 0xf0) {
		case 0x80:    // note-off: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "note-off " + keyToPitchName(byte1);
			}
			break;
		case 0x90:    // note-on: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				if (byte2 == 0) {
					comment += "note-off " + keyToPitchName(byte1);
				} else {
					comment += "note-on " + keyToPitchName(byte1);
				}
			}
			break;
		case 0xA0:    // aftertouch: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "after-touch";
			}
			break;
		case 0xB0:    // continuous controller: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "controller";
			}
			break;
		case 0xE0:    // pitch-bend: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "pitch-bend";
			}
			break;
		case 0xC0:    // patch change: 1 bytes
			output << " '" << std::dec << (int)byte1;
			if (m_commentsQ) {
				output << "\t";
				comment += "patch-change (";
				comment += GMinstrument[byte1 & 0x7f];
				comment += ")";
			}
			break;
		case 0xD0:    // channel pressure: 1 bytes
			output << " '" << std::dec << (int)byte1;
			if (m_commentsQ) {
				comment += "channel pressure";
			}
			break;
		case 0xF0:    // various system bytes: variable bytes
			switch (command) {
				case 0xf0:
					{
					// A system exclusive message.   The first byte
					// is 0xf0, then a VLV of the length of the message
					// and then the message itself (which must end with 0xf7).
					int length = getVLV(infile, trackbytes);
					output << " v" << std::dec << length;
					for (int b=0; b<length; b++) {
						infile.read((char*)&ch, 1);
						trackbytes++;
						if (ch < 0x10) {
						   output << " 0" << std::hex << (int)ch;
						} else {
						   output << " " << std::hex << (int)ch;
						}
					}
					}
					break;
				case 0xf7:
					// Read the first byte which is either 0xf0 or 0xf7.
					// Then a VLV byte count for the number of bytes
					// that remain in the message will follow.
					// Then read that number of bytes.
					{
					infile.putback(byte1);
					trackbytes--;
					int length = getVLV(infile, trackbytes);
					output << " v" << std::dec << length;
					for (int i=0; i<length; i++) {
						infile.read((char*)&ch, 1);
						trackbytes++;
						if (ch < 0x10) {
						   output << " 0" << std::hex << (int)ch;
						} else {
						   output << " " << std::hex << (int)ch;
						}
					}
					}
					break;
				case 0xf1:
					break;
				case 0xf2:
					break;
				case 0xf3:
					break;
				case 0xf4:
					break;
				case 0xf5:
					break;
				case 0xf6:
					break;
				case 0xf8:
					break;
				case 0xf9:
					break;
				case 0xfa:
					break;
				case 0xfb:
					break;
				case 0xfc:
					break;
				case 0xfd:
					break;
				case 0xfe:
					std::cerr << "Error command not yet handled" << std::endl;
					return 0;
					break;
				case 0xff:  // meta message
					{
					int metatype = ch;
					output << " " << std::hex << metatype;
					int length = getVLV(infile, trackbytes);
					output << " v" << std::dec << length;
					switch (metatype) {

						case 0x00:  // sequence number
						   // display two-byte big-endian decimal value.
						   {
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   int number = ch;
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   number = (number << 8) | ch;
						   output << " 2'" << number;
						   }
						   break;

						case 0x20: // MIDI channel prefix
						case 0x21: // MIDI port
						   // display single-byte decimal number
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   output << " '" << (int)ch;
						   break;

						case 0x51: // Tempo
						    // display tempo as "t" word.
						    {
						    int number = 0;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    double tempo = 1000000.0 / number * 60.0;
						    output << " t" << tempo;
						    }
						    break;

						case 0x54: // SMPTE offset
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // hour
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // minutes
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // seconds
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // frames
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // subframes
						    break;

						case 0x58: // time signature
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // numerator
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // denominator power
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // clocks per beat
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // 32nd notes per beat
						    break;

						case 0x59: // key signature
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // accidentals
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // mode
						    break;

						case 0x01: // text
						case 0x02: // copyright
						case 0x03: // track name
						case 0x04: // instrument name
						case 0x05: // lyric
						case 0x06: // marker
						case 0x07: // cue point
						case 0x08: // program name
						case 0x09: // device name
						   output << " \"";
						   for (int i=0; i<length; i++) {
						      infile.read((char*)&ch, 1);
						      trackbytes++;
								if (ch == '"') {
									output << '\\';
								}
						      output << (char)ch;
						   }
						   output << "\"";
						   break;
						default:
						   for (int i=0; i<length; i++) {
						      infile.read((char*)&ch, 1);
						      trackbytes++;
						      output << " ";
						      if (ch < 0x10) {
						         output << "0";
						      }
						      output << std::hex << (int)ch;
						   }
					}
					switch (metatype) {
						case 0x00: comment += "sequence number";     break;
						case 0x01: comment += "text";                break;
						case 0x02: comment += "copyright notice";    break;
						case 0x03: comment += "track name";          break;
						case 0x04: comment += "instrument name";     break;
						case 0x05: comment += "lyric";               break;
						case 0x06: comment += "marker";              break;
						case 0x07: comment += "cue point";           break;
						case 0x08: comment += "program name";        break;
						case 0x09: comment += "device name";         break;
						case 0x20: comment += "MIDI channel prefix"; break;
						case 0x21: comment += "MIDI port";           break;
						case 0x51: comment += "tempo";               break;
						case 0x54: comment += "SMPTE offset";        break;
						case 0x58: comment += "time signature";      break;
						case 0x59: comment += "key signature";       break;
						case 0x7f: comment += "system exclusive";    break;
						case 0x2f:
						   status = 0;
						   comment += "end-of-track";
						   break;
						default:
						   comment += "meta-message";
					}
					}
					break;

			}
			break;
	}

	out << output.str();
	if (m_commentsQ) {
		out << "\t; " << comment;
	}

	return status;
}